

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * mi_reallocn(void *p,size_t count,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  
  if ((count == 1) ||
     (auVar1._8_8_ = 0, auVar1._0_8_ = count, auVar2._8_8_ = 0, auVar2._0_8_ = size,
     size = SUB168(auVar1 * auVar2,0), SUB168(auVar1 * auVar2,8) == 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    size = 0xffffffffffffffff;
  }
  if (!bVar3) {
    pvVar4 = _mi_heap_realloc_zero(*(mi_heap_t **)(in_FS_OFFSET + -0x28),p,size,false);
    return pvVar4;
  }
  return (void *)0x0;
}

Assistant:

mi_decl_nodiscard void* mi_reallocn(void* p, size_t count, size_t size) mi_attr_noexcept {
  return mi_heap_reallocn(mi_prim_get_default_heap(),p,count,size);
}